

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pose2texture.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  float fVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  int row_1;
  int iVar5;
  basic_ostream<char,_std::char_traits<char>_> *pbVar6;
  long lVar7;
  char *pcVar8;
  size_t sVar9;
  ostream *poVar10;
  long *plVar11;
  long *plVar12;
  size_type *psVar13;
  ulong uVar14;
  long lVar15;
  int row;
  long lVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  int iVar22;
  long *plVar23;
  path vuiimpath;
  path bgrimbasename;
  path teximpath;
  path vuipath;
  vector<cv::Mat,_std::allocator<cv::Mat>_> tiles;
  Mat vuisrc;
  int option_index;
  path bgrimpath;
  Mat texture;
  Mat imgsrc;
  Mat cumul;
  allocator local_439;
  char *local_438;
  long local_430;
  char local_428 [16];
  ulong local_418;
  undefined1 *local_410 [2];
  undefined1 local_400 [16];
  _InputArray local_3f0;
  char *local_3d8;
  long local_3d0;
  char local_3c8 [16];
  undefined1 *local_3b8;
  long local_3b0;
  undefined1 local_3a8 [16];
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_398;
  long *local_378;
  long lStack_370;
  long local_368;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  uint *local_338;
  long *local_330;
  ulong local_310;
  undefined8 local_304;
  undefined4 local_2fc;
  void *local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined1 local_2d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8 [6];
  Mat local_268 [96];
  Mat local_208 [144];
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  long *local_158 [2];
  long local_148 [7];
  long *local_110;
  _InputArray local_f8 [3];
  long *local_b0;
  undefined8 local_98;
  allocator local_90 [16];
  long local_80;
  long *local_48;
  
  local_3b8 = local_3a8;
  local_3b0 = 0;
  local_3a8[0] = 0;
  local_2fc = 0;
  do {
    while (iVar5 = getopt_long(argc,argv,"hv:i:",long_options,&local_2fc), iVar5 == 0x69) {
      std::__cxx11::string::string((string *)local_2d8,_optarg,local_90);
      std::__cxx11::string::operator=((string *)&local_3b8,(string *)local_2d8);
      if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
        operator_delete((void *)local_2d8._0_8_);
      }
    }
  } while (iVar5 != -1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vui-folder: ",0xc);
  local_2d8._0_8_ = local_2d8 + 0x10;
  std::__cxx11::string::_M_construct<char*>((string *)local_2d8,local_3b8,local_3b8 + local_3b0);
  pbVar6 = boost::io::detail::quoted_out<char,std::char_traits<char>,std::__cxx11::string_const>
                     ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8
                      ,'&','\"');
  if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
    operator_delete((void *)local_2d8._0_8_);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)pbVar6 + -0x18) + (char)pbVar6);
  std::ostream::put((char)pbVar6);
  std::ostream::flush();
  local_98 = 0x4b000000320;
  local_2c8[0]._M_allocated_capacity = 0;
  local_2c8[0]._8_8_ = 0;
  local_2d8._0_8_ = (long *)0x0;
  local_2d8._8_8_ = 0;
  cv::Mat::Mat((Mat *)local_90,&local_98,0x1d);
  lVar16 = (long)_optind;
  if (_optind < argc) {
    do {
      plVar23 = (long *)(local_2d8 + 0x10);
      std::__cxx11::string::string((string *)local_178,argv[lVar16],(allocator *)local_2d8);
      boost::filesystem::path::stem();
      local_f8[0]._0_8_ = &local_f8[0].sz;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_f8,local_2d8._0_8_,(pointer)(local_2d8._0_8_ + local_2d8._8_8_));
      if ((long *)local_2d8._0_8_ != plVar23) {
        operator_delete((void *)local_2d8._0_8_);
      }
      local_410[0] = local_400;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_410,local_f8[0]._0_8_,(long)local_f8[0].obj + local_f8[0]._0_8_);
      if ((Size *)local_f8[0]._0_8_ != &local_f8[0].sz) {
        operator_delete((void *)local_f8[0]._0_8_);
      }
      lVar7 = std::__cxx11::string::find((char *)local_410,0x105072,0);
      if (lVar7 == -1) {
        lVar7 = std::__cxx11::string::find((char *)local_410,0x105091,0);
        if (lVar7 != -1) {
          pcVar8 = basename(*argv);
          if (pcVar8 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x108120);
          }
          else {
            sVar9 = strlen(pcVar8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar8,sVar9);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,": skipping _IUV file  \'",0x17);
          goto LAB_00102975;
        }
        std::__cxx11::string::string((string *)local_2d8,argv[lVar16],(allocator *)&local_378);
        iVar5 = (int)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8;
        cv::imread((string *)local_f8,iVar5);
        if ((long *)local_2d8._0_8_ != plVar23) {
          operator_delete((void *)local_2d8._0_8_);
        }
        cVar4 = cv::Mat::empty();
        if (cVar4 == '\0') {
          if ((local_f8[0].flags & 0xff8U) != 0x10) {
            pcVar8 = basename(*argv);
            if (pcVar8 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x108120);
            }
            else {
              sVar9 = strlen(pcVar8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar8,sVar9)
              ;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,": image file is not RGB \'",0x19);
            goto LAB_00102bff;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"processing: ",0xc);
          std::__cxx11::string::string((string *)local_2d8,argv[lVar16],(allocator *)&local_378);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(char *)local_2d8._0_8_,local_2d8._8_8_);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          if ((long *)local_2d8._0_8_ != plVar23) {
            operator_delete((void *)local_2d8._0_8_);
          }
          local_158[0] = local_148;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"_IUV.png","");
          plVar11 = (long *)std::__cxx11::string::replace
                                      ((ulong)local_158,0,(char *)0x0,(ulong)local_410[0]);
          local_378 = &local_368;
          plVar12 = plVar11 + 2;
          if ((long *)*plVar11 == plVar12) {
            local_368 = *plVar12;
            uStack_360 = (undefined4)plVar11[3];
            uStack_35c = *(undefined4 *)((long)plVar11 + 0x1c);
          }
          else {
            local_368 = *plVar12;
            local_378 = (long *)*plVar11;
          }
          lStack_370 = plVar11[1];
          *plVar11 = (long)plVar12;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          local_2d8._0_8_ = plVar23;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2d8,local_378,lStack_370 + (long)local_378);
          local_438 = local_428;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_438,local_3b8,local_3b8 + local_3b0);
          boost::filesystem::path::operator/=((path *)&local_438,(path *)local_2d8);
          if ((long *)local_2d8._0_8_ != plVar23) {
            operator_delete((void *)local_2d8._0_8_);
          }
          if (local_378 != &local_368) {
            operator_delete(local_378);
          }
          if (local_158[0] != local_148) {
            operator_delete(local_158[0]);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t- ",3);
          local_2d8._0_8_ = plVar23;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2d8,local_438,local_438 + local_430);
          pbVar6 = boost::io::detail::
                   quoted_out<char,std::char_traits<char>,std::__cxx11::string_const>
                             ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_2d8,'&','\"');
          if ((long *)local_2d8._0_8_ != plVar23) {
            operator_delete((void *)local_2d8._0_8_);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)pbVar6 + -0x18) + (char)pbVar6);
          std::ostream::put((char)pbVar6);
          std::ostream::flush();
          std::__cxx11::string::string((string *)local_2d8,local_438,(allocator *)local_158);
          cv::imread((string *)&local_378,iVar5);
          if ((long *)local_2d8._0_8_ != plVar23) {
            operator_delete((void *)local_2d8._0_8_);
          }
          cVar4 = cv::Mat::empty();
          if (cVar4 == '\0') {
            if (((uint)local_378 & 0xff8) != 0x10) {
              pcVar8 = basename(*argv);
              if (pcVar8 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x108120);
              }
              else {
                sVar9 = strlen(pcVar8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,pcVar8,sVar9);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,": image file is not RGB \'",0x19);
              local_2d8._0_8_ = plVar23;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_2d8,local_438,local_438 + local_430);
              pbVar6 = boost::io::detail::
                       quoted_out<char,std::char_traits<char>,std::__cxx11::string_const>
                                 ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_2d8,'&','\"');
              if ((long *)local_2d8._0_8_ != plVar23) {
                operator_delete((void *)local_2d8._0_8_);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar6,"\'",1);
              std::ios::widen((char)*(undefined8 *)(*(long *)pbVar6 + -0x18) + (char)pbVar6);
              goto LAB_001030a2;
            }
            uVar17 = *local_338;
            local_418 = (ulong)local_338[1];
            local_158[0] = local_148;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"_TEX.png","");
            plVar11 = (long *)std::__cxx11::string::replace
                                        ((ulong)local_158,0,(char *)0x0,(ulong)local_410[0]);
            psVar13 = (size_type *)(plVar11 + 2);
            if ((size_type *)*plVar11 == psVar13) {
              local_2c8[0]._0_8_ = *psVar13;
              local_2c8[0]._8_8_ = plVar11[3];
              local_2d8._0_8_ = plVar23;
            }
            else {
              local_2c8[0]._0_8_ = *psVar13;
              local_2d8._0_8_ = (size_type *)*plVar11;
            }
            local_2d8._8_8_ = plVar11[1];
            *plVar11 = (long)psVar13;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            local_3d8 = local_3c8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_3d8,local_2d8._0_8_,
                       (pointer)(local_2d8._0_8_ + local_2d8._8_8_));
            if ((long *)local_2d8._0_8_ != plVar23) {
              operator_delete((void *)local_2d8._0_8_);
            }
            if (local_158[0] != local_148) {
              operator_delete(local_158[0]);
            }
            local_310 = (ulong)uVar17;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t- ",3);
            local_2d8._0_8_ = plVar23;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_2d8,local_3d8,local_3d8 + local_3d0);
            pbVar6 = boost::io::detail::
                     quoted_out<char,std::char_traits<char>,std::__cxx11::string_const>
                               ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_2d8,'&','\"');
            if ((long *)local_2d8._0_8_ != plVar23) {
              operator_delete((void *)local_2d8._0_8_);
            }
            std::ios::widen((char)*(undefined8 *)(*(long *)pbVar6 + -0x18) + (char)pbVar6);
            std::ostream::put((char)pbVar6);
            std::ostream::flush();
            local_304 = 0x4b000000320;
            local_2c8[0]._M_allocated_capacity = 0;
            local_2c8[0]._8_8_ = 0;
            local_2d8._0_8_ = (long *)0x0;
            local_2d8._8_8_ = 0;
            cv::Mat::Mat((Mat *)local_158,&local_304,0x1d);
            local_398.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_398.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_398.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            iVar5 = 0;
            do {
              iVar22 = 0;
              do {
                local_3f0.obj = (void *)0xc8000000c8;
                local_3f0.flags = iVar5 * 200;
                local_3f0._4_4_ = iVar22;
                cv::Mat::Mat((Mat *)local_2d8,(Mat *)local_158,(Rect_ *)&local_3f0);
                std::vector<cv::Mat,_std::allocator<cv::Mat>_>::emplace_back<cv::Mat>
                          (&local_398,(Mat *)local_2d8);
                cv::Mat::~Mat((Mat *)local_2d8);
                iVar22 = iVar22 + 200;
              } while (iVar22 != 0x4b0);
              iVar5 = iVar5 + 1;
            } while (iVar5 != 4);
            if (0 < (int)local_310) {
              uVar14 = 0;
              do {
                if (0 < (int)local_418) {
                  lVar7 = 0;
                  do {
                    lVar15 = *local_330 * uVar14 + local_368;
                    uVar17 = *(byte *)(lVar7 + lVar15) & 0x1f;
                    if ((((byte)((char)uVar17 - 1U) < 0x18) &&
                        (uVar19 = (uint)(((255.0 - (double)*(byte *)(lVar7 + 2 + lVar15)) * 199.0) /
                                        255.0), uVar19 < 200)) &&
                       (uVar21 = (uint)(((double)*(byte *)(lVar7 + 1 + lVar15) * 199.0) / 255.0),
                       uVar21 < 200)) {
                      lVar18 = *local_b0 * uVar14 + (long)local_f8[0].sz;
                      bVar2 = *(byte *)(lVar7 + 1 + lVar18);
                      lVar15 = (ulong)(uVar17 - 1) * 0x60;
                      lVar20 = (ulong)uVar19 *
                               **(long **)(local_398.
                                           super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                           _M_impl.super__Vector_impl_data._M_start + lVar15 + 0x48)
                               + *(long *)(local_398.
                                           super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                           _M_impl.super__Vector_impl_data._M_start + lVar15 + 0x10)
                      ;
                      lVar15 = (ulong)uVar21 * 0x10;
                      bVar3 = *(byte *)(lVar7 + 2 + lVar18);
                      *(float *)(lVar15 + lVar20) =
                           (float)*(byte *)(lVar7 + lVar18) + *(float *)(lVar15 + lVar20);
                      *(float *)(lVar15 + 4 + lVar20) =
                           (float)bVar2 + *(float *)(lVar15 + 4 + lVar20);
                      *(float *)(lVar15 + 8 + lVar20) =
                           (float)bVar3 + *(float *)(lVar15 + 8 + lVar20);
                      *(float *)(lVar15 + 0xc + lVar20) = *(float *)(lVar15 + 0xc + lVar20) + 1.0;
                    }
                    lVar7 = lVar7 + 3;
                  } while (local_418 * 3 != lVar7);
                }
                uVar14 = uVar14 + 1;
              } while (uVar14 != local_310);
            }
            cv::operator+((Mat *)local_2d8,(Mat *)local_90);
            (**(code **)(*(long *)local_2d8._0_8_ + 0x18))
                      (local_2d8._0_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2d8,(Mat *)local_90,0xffffffff);
            cv::Mat::~Mat(local_208);
            cv::Mat::~Mat(local_268);
            cv::Mat::~Mat((Mat *)(local_2d8 + 0x10));
            lVar7 = 0;
            do {
              lVar15 = 0xc;
              do {
                lVar18 = *local_110 * lVar7 + local_148[0];
                fVar1 = *(float *)(lVar15 + lVar18);
                *(float *)(lVar15 + -0xc + lVar18) = *(float *)(lVar15 + -0xc + lVar18) / fVar1;
                *(float *)(lVar15 + -8 + lVar18) = *(float *)(lVar15 + -8 + lVar18) / fVar1;
                *(float *)(lVar15 + -4 + lVar18) = *(float *)(lVar15 + -4 + lVar18) / fVar1;
                *(uint *)(lVar15 + lVar18) = -(uint)(fVar1 != 0.0) & 0x437f0000;
                lVar15 = lVar15 + 0x10;
              } while (lVar15 != 0x320c);
              lVar7 = lVar7 + 1;
            } while (lVar7 != 0x4b0);
            std::__cxx11::string::string((string *)local_2d8,local_3d8,&local_439);
            local_3f0.sz.width = 0;
            local_3f0.sz.height = 0;
            local_3f0.flags = 0x1010000;
            local_2e8 = 0;
            local_2f8 = (void *)0x0;
            uStack_2f0 = 0;
            local_3f0.obj = (Mat *)local_158;
            cv::imwrite((string *)local_2d8,&local_3f0,(vector *)&local_2f8);
            if (local_2f8 != (void *)0x0) {
              operator_delete(local_2f8);
            }
            if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
              operator_delete((void *)local_2d8._0_8_);
            }
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
            std::ostream::put(-0x10);
            std::ostream::flush();
            std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_398);
            cv::Mat::~Mat((Mat *)local_158);
            if (local_3d8 != local_3c8) {
              operator_delete(local_3d8);
            }
          }
          else {
            pcVar8 = basename(*argv);
            if (pcVar8 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x108120);
            }
            else {
              sVar9 = strlen(pcVar8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar8,sVar9)
              ;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,": could not open file or invalid image file  \'",0x2e)
            ;
            local_2d8._0_8_ = local_2d8 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_2d8,local_438,local_438 + local_430);
            pbVar6 = boost::io::detail::
                     quoted_out<char,std::char_traits<char>,std::__cxx11::string_const>
                               ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_2d8,'&','\"');
            if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
              operator_delete((void *)local_2d8._0_8_);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar6,"\'",1);
            std::ios::widen((char)*(undefined8 *)(*(long *)pbVar6 + -0x18) + (char)pbVar6);
LAB_001030a2:
            std::ostream::put((char)pbVar6);
            std::ostream::flush();
          }
          cv::Mat::~Mat((Mat *)&local_378);
          if (local_438 != local_428) {
            operator_delete(local_438);
          }
        }
        else {
          pcVar8 = basename(*argv);
          if (pcVar8 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x108120);
          }
          else {
            sVar9 = strlen(pcVar8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar8,sVar9);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,": could not open file or invalid image file  \'",0x2e);
LAB_00102bff:
          pcVar8 = argv[lVar16];
          if (pcVar8 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x108120);
          }
          else {
            sVar9 = strlen(pcVar8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar8,sVar9);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'",1);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
          std::ostream::put(' ');
          std::ostream::flush();
        }
        cv::Mat::~Mat((Mat *)local_f8);
      }
      else {
        pcVar8 = basename(*argv);
        if (pcVar8 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x108120);
        }
        else {
          sVar9 = strlen(pcVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar8,sVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,": skipping _INDS file  \'",0x18);
LAB_00102975:
        pcVar8 = argv[lVar16];
        if (pcVar8 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x108120);
        }
        else {
          sVar9 = strlen(pcVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar8,sVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'",1);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
        std::ostream::put(' ');
        std::ostream::flush();
      }
      if (local_410[0] != local_400) {
        operator_delete(local_410[0]);
      }
      if (local_178[0] != local_168) {
        operator_delete(local_178[0]);
      }
      lVar16 = lVar16 + 1;
    } while ((int)lVar16 != argc);
  }
  lVar16 = 0;
  do {
    lVar7 = 0xc;
    do {
      lVar15 = *local_48 * lVar16 + local_80;
      fVar1 = *(float *)(lVar7 + lVar15);
      *(float *)(lVar7 + -0xc + lVar15) = *(float *)(lVar7 + -0xc + lVar15) / fVar1;
      *(float *)(lVar7 + -8 + lVar15) = *(float *)(lVar7 + -8 + lVar15) / fVar1;
      *(float *)(lVar7 + -4 + lVar15) = *(float *)(lVar7 + -4 + lVar15) / fVar1;
      *(uint *)(lVar7 + lVar15) = -(uint)(fVar1 != 0.0) & 0x437f0000;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x320c);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x4b0);
  local_2d8._0_8_ = local_2d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"cumul.png","");
  local_f8[0].sz.width = 0;
  local_f8[0].sz.height = 0;
  local_f8[0].flags = 0x1010000;
  local_f8[0].obj = local_90;
  local_368 = 0;
  local_378 = (long *)0x0;
  lStack_370 = 0;
  cv::imwrite((string *)local_2d8,local_f8,(vector *)&local_378);
  if (local_378 != (long *)0x0) {
    operator_delete(local_378);
  }
  if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
    operator_delete((void *)local_2d8._0_8_);
  }
  cv::Mat::~Mat((Mat *)local_90);
  if (local_3b8 != local_3a8) {
    operator_delete(local_3b8);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv )
{
    boost::filesystem::path vuipath;

    int 	option_index = 0;
    while(1) {
        int c = getopt_long (argc, argv, "hv:i:",long_options, &option_index);
        if (c == -1)
            break;  // end of options
        switch (c) {
        case 'v':
            //verbose_level=atoi(optarg);
            break;
        case 'h':
            //usage(cerr,basename(argv[0]));
            //exit(1);
            break;		// never reached
        case 'i':
            // path to _INDS.png and _IUV.png folder
            vuipath=boost::filesystem::path(optarg);
            break;
        }
    }


    cout << "vui-folder: " << vuipath << endl;
    Mat   cumul(Size(800,1200),CV_32FC4,Scalar(0,0,0,0));
    int count=0;

    for(int i=optind; i<argc; i++) {
        boost::filesystem::path bgrimpath(argv[i]);
        boost::filesystem::path bgrimbasename=basename(bgrimpath);
        // skip *_INDS.png, *._IUV.png
        if(string::npos!=bgrimbasename.string().find("_INDS")) {
            cerr << basename(argv[0]) << ": skipping _INDS file  '" << argv[i] << "'" << endl;
            continue;
        }
        if(string::npos!=bgrimbasename.string().find("_IUV")) {
            cerr << basename(argv[0]) << ": skipping _IUV file  '" << argv[i] << "'" << endl;
            continue;
        }

        // read the source image file
        Mat imgsrc=imread(argv[i],1);
        if(imgsrc.empty()) {
            cerr << basename(argv[0]) << ": could not open file or invalid image file  '" << argv[i] << "'" << endl;
            continue;
        }
        if(imgsrc.channels()!=3) {
            cerr << basename(argv[0]) << ": image file is not RGB '" << argv[i] << "'" << endl;
            continue;
        }

        Size srcsize=imgsrc.size();

        cout << "processing: " << string(argv[i]) << endl;

        // get IUV file
        boost::filesystem::path vuiimpath= vuipath / boost::filesystem::path(bgrimbasename.string() + string("_IUV.png"));
        cout << "\t- " << vuiimpath << endl;

        Mat vuisrc=imread(vuiimpath.c_str(),1);
        if(vuisrc.empty()) {
            cerr << basename(argv[0]) << ": could not open file or invalid image file  '" << vuiimpath << "'" << endl;
            continue;
        }
        if(vuisrc.channels()!=3) {
            cerr << basename(argv[0]) << ": image file is not RGB '" << vuiimpath << "'" << endl;
            continue;
        }
        Size vuisize=vuisrc.size();
        /*
        // get INDS file
        boost::filesystem::path indimpath= vuipath / boost::filesystem::path(bgrimbasename.string() + string("_INDS.png"));
        cout << "\t- " << indimpath << endl;

        Mat indsrc=imread(indimpath.c_str(),-1);
        if(indsrc.empty()) {
            cerr << basename(argv[0]) << ": could not open file or invalid image file  '" << indimpath << "'" << endl;
            continue;
        }
        if(indsrc.channels()!=1) {
            cerr << basename(argv[0]) << ": image file is not 1 channel'" << indimpath << "'" << endl;
            continue;
        }
        Size indsize=indsrc.size();

        // get number of different values in ind matrix => should be nb of people seen
        std::vector<unsigned char> unik = unique(indsrc, true);

        for (unsigned int i = 0; i < unik.size(); i++)
            std::cout << (short)unik[i] << " ";
        */
        boost::filesystem::path teximpath= boost::filesystem::path(bgrimbasename.string() + string("_TEX.png"));
        cout << "\t- " << teximpath << endl;



        Mat   texture(Size(800,1200),CV_32FC4,Scalar(0,0,0,0));
        //Mat   texture=imread("SURREAL.png",1);
        //4x6=24 tiles, tile size 200*200
        vector<Mat>  tiles;
        for(int row=0; row<4; row++)
            for(int col=0; col<6; col++)
                tiles.push_back(texture(Rect(200*row,200*col,200,200)));


        //Mat   out=imgsrc;
        //out=Scalar(0,0,0);
        for(int row=0; row<vuisize.height; row++)
            for(int col=0; col<vuisize.width; col++) {
                unsigned int ind=0;
                Vec3b        vui=vuisrc.at<Vec3b>(row,col);

                int i= (unsigned)0x1F & vui[0];
                int u=(255.-float(vui[2]))*199./255.;
                int v=float(vui[1])*199./255.;
                /*
                if((i>0)&&(i<25))
                    if((u>=0)&&(u<200))
                        if((v>=0)&&(v<200))
                out.at<Vec3b>(row,col)=tiles[i-1].at<Vec3b>(u,v);
                */
                if((i>0)&&(i<25))
                    if((u>=0)&&(u<200))
                        if((v>=0)&&(v<200)) {
                            Vec3b pixsrc=imgsrc.at<Vec3b>(row,col); // image pixel
                            Vec4f texsrc=tiles[i-1].at<Vec4f>(u,v);
                            texsrc[0]+=(float)pixsrc[0];
                            texsrc[1]+=(float)pixsrc[1];
                            texsrc[2]+=(float)pixsrc[2];
                            texsrc[3]+=(float)1.0;
                            tiles[i-1].at<Vec4f>(u,v)=texsrc;
                            //tiles[i-1].at<Vec3b>(u,v)=imgsrc.at<Vec3b>(row,col);
                        }
            }
        cumul=cumul+texture;
        count+=1;
        for(int row=0; row<1200; row++)
            for(int col=0; col<800; col++) {
                Vec4f texsrc=texture.at<Vec4f>(row,col);
                texsrc[0]=float(texsrc[0])/float(texsrc[3]);
                texsrc[1]=float(texsrc[1])/float(texsrc[3]);
                texsrc[2]=float(texsrc[2])/float(texsrc[3]);
                texsrc[3]=(float)(texsrc[3] ? 255.0:0.0);
                texture.at<Vec4f>(row,col)=texsrc;
            }
        imwrite(teximpath.c_str(),texture);

        cout << endl;
    }

    for(int row=0; row<1200; row++)
        for(int col=0; col<800; col++) {
            Vec4f texsrc=cumul.at<Vec4f>(row,col);
            texsrc[0]=float(texsrc[0])/float(texsrc[3]);
            texsrc[1]=float(texsrc[1])/float(texsrc[3]);
            texsrc[2]=float(texsrc[2])/float(texsrc[3]);
            //texsrc[3]=(float)255.0;
            texsrc[3]=(float)(texsrc[3] ? 255.0:0.0);
            cumul.at<Vec4f>(row,col)=texsrc;
        }
    imwrite("cumul.png",cumul);

    return 0;
}